

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.hh
# Opt level: O2

int __thiscall
tchecker::waiting::
queue_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>_>
::remove(queue_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>_>
         *this,char *__filename)

{
  const_iterator local_68;
  iterator local_48;
  
  local_68._M_cur =
       (this->_dq).
       super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_68._M_node =
       (this->_dq).
       super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_node;
  local_68._M_last =
       (this->_dq).
       super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_last;
  local_68._M_first =
       (this->_dq).
       super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_first;
LAB_0013987b:
  do {
    do {
      if (local_68._M_cur ==
          (this->_dq).
          super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
        return (int)local_68._M_cur;
      }
      if ((local_68._M_cur)->_t ==
          *(make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>
            **)__filename) {
        std::
        deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>_>_>
        ::erase(&local_48,&this->_dq,&local_68);
        local_68._M_cur = local_48._M_cur;
        local_68._M_node = local_48._M_node;
        local_68._M_last = local_48._M_last;
        local_68._M_first = local_48._M_first;
        goto LAB_0013987b;
      }
      local_68._M_cur = local_68._M_cur + 1;
    } while (local_68._M_cur != local_68._M_last);
    local_68._M_cur = local_68._M_node[1];
    local_68._M_node = local_68._M_node + 1;
    local_68._M_last = local_68._M_cur + 0x40;
    local_68._M_first = local_68._M_cur;
  } while( true );
}

Assistant:

virtual void remove(T const & t)
  {
    for (auto it = _dq.begin(); it != _dq.end();) {
      if (*it == t)
        it = _dq.erase(it);
      else
        ++it;
    }
  }